

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkCreateMemoryConstr
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,Vec_Int_t *vReachReadCi)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *__ptr;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *p_00;
  int *piVar9;
  Wlc_Obj_t *pWVar10;
  Vec_Int_t *__ptr_01;
  int *piVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  long lVar13;
  ushort uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  
  uVar19 = 0xffffffff;
  __ptr = Wlc_NtkCollectOneType(p,vMemObjsClean,0x36,-1);
  __ptr_00 = Wlc_NtkCollectOneType(p,vMemObjsClean,1,3);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  p_00->pArray = piVar9;
  iVar2 = __ptr->nSize;
  if (0 < (long)iVar2) {
    piVar9 = __ptr->pArray;
    lVar13 = 0;
    do {
      iVar3 = piVar9[lVar13];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_003614c6;
      pWVar10 = p->pObjs + iVar3;
      __ptr_01 = Wlc_NtkExtractCisForThisRead(vReachReadCi,iVar3);
      iVar3 = __ptr_00->nSize;
      if (0 < (long)iVar3) {
        piVar11 = __ptr_00->pArray;
        lVar15 = 0;
        do {
          iVar17 = piVar11[lVar15];
          if (((long)iVar17 < 1) || (p->nObjsAlloc <= iVar17)) goto LAB_003614c6;
          if ((p->vCopies).nSize <= iVar17) goto LAB_003614e5;
          (p->vCopies).pArray[iVar17] = -1;
          lVar15 = lVar15 + 1;
        } while (iVar3 != lVar15);
      }
      iVar3 = __ptr_01->nSize;
      if (1 < iVar3) {
        piVar11 = __ptr_01->pArray;
        lVar15 = 1;
        do {
          iVar17 = piVar11[lVar15 + -1];
          if (((long)iVar17 < 0) || ((p->vCopies).nSize <= iVar17)) goto LAB_003614e5;
          uVar6 = piVar11[lVar15];
          uVar19 = (ulong)uVar6;
          (p->vCopies).pArray[iVar17] = uVar6;
          lVar15 = lVar15 + 2;
        } while ((int)lVar15 < iVar3);
      }
      if (__ptr_01->pArray != (int *)0x0) {
        free(__ptr_01->pArray);
        __ptr_01->pArray = (int *)0x0;
      }
      if (__ptr_01 != (Vec_Int_t *)0x0) {
        free(__ptr_01);
      }
      if (0 < vMemObjsClean->nSize) {
        lVar15 = 0;
        do {
          iVar3 = vMemObjsClean->pArray[lVar15];
          lVar16 = (long)iVar3;
          if ((lVar16 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_003614c6;
          pWVar4 = p->pObjs;
          if ((undefined1  [24])((undefined1  [24])pWVar4[lVar16] & (undefined1  [24])0x3d) !=
              (undefined1  [24])0x1 &&
              (undefined1  [24])((undefined1  [24])pWVar4[lVar16] & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x36) {
            if ((p->vCopies).nSize <= iVar3) goto LAB_003614e5;
            pWVar1 = pWVar4 + lVar16;
            piVar11 = (p->vCopies).pArray;
            piVar11[lVar16] = -1;
            uVar14 = *(ushort *)pWVar1 & 0x3f;
            if (uVar14 == 7) {
              paVar12 = &pWVar1->field_10;
              if (2 < pWVar1->nFanins) {
                paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
              }
              iVar3 = paVar12->Fanins[0];
              if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) goto LAB_00361504;
              uVar19 = (ulong)(uint)piVar11[iVar3];
              if (piVar11[iVar3] == 0xffffffff) {
                uVar19 = 0xffffffff;
              }
              else {
LAB_00361259:
                uVar6 = (int)((long)pWVar1 - (long)p->pObjs >> 3) * -0x55555555;
                if (((int)uVar6 < 0) || ((p->vCopies).nSize <= (int)uVar6)) goto LAB_003614e5;
                (p->vCopies).pArray[uVar6 & 0x7fffffff] = (int)uVar19;
              }
            }
            else if (uVar14 == 8) {
              paVar12 = &pWVar1->field_10;
              if (2 < pWVar1->nFanins) {
                paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
              }
              iVar3 = paVar12->Fanins[1];
              if (((long)iVar3 < 0) || (iVar17 = (p->vCopies).nSize, iVar17 <= iVar3))
              goto LAB_00361504;
              paVar12 = &pWVar1->field_10;
              if (2 < pWVar1->nFanins) {
                paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
              }
              iVar18 = paVar12[1].Fanins[0];
              if (((long)iVar18 < 0) || (iVar17 <= iVar18)) goto LAB_00361504;
              uVar6 = piVar11[iVar3];
              uVar8 = piVar11[iVar18];
              if (uVar8 != 0xffffffff && uVar6 != 0xffffffff) {
                iVar17 = pWVar10->End - pWVar10->Beg;
                iVar3 = -iVar17;
                if (0 < iVar17) {
                  iVar3 = iVar17;
                }
                if (((int)uVar6 < 1) || (pNew->nObjsAlloc <= (int)uVar6)) goto LAB_003614c6;
                pWVar4 = pNew->pObjs;
                iVar18 = pWVar4[uVar6].End - pWVar4[uVar6].Beg;
                iVar17 = -iVar18;
                if (0 < iVar18) {
                  iVar17 = iVar18;
                }
                if (iVar3 != iVar17) {
                  __assert_fail("Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin0New))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                                ,0x53b,
                                "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
                if (((int)uVar8 < 1) || (pNew->nObjsAlloc <= (int)uVar8)) goto LAB_003614c6;
                iVar18 = pWVar4[uVar8].End - pWVar4[uVar8].Beg;
                iVar17 = -iVar18;
                if (0 < iVar18) {
                  iVar17 = iVar18;
                }
                if (iVar3 != iVar17) {
                  __assert_fail("Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin1New))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                                ,0x53c,
                                "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
                uVar7 = Wlc_ObjAlloc(pNew,8,0,iVar3,0);
                uVar19 = (ulong)uVar7;
                if ((pWVar1->nFanins < 3) &&
                   ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
                    (undefined1  [24])0x6)) {
                  paVar12 = &pWVar1->field_10;
                }
                else {
                  paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                            (pWVar1->field_10).pFanins[0];
                }
                iVar3 = paVar12->Fanins[0];
                if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) goto LAB_00361504;
                iVar3 = (p->vCopies).pArray[iVar3];
                if (p_00->nCap < 1) {
                  if (p_00->pArray == (int *)0x0) {
                    piVar11 = (int *)malloc(4);
                  }
                  else {
                    piVar11 = (int *)realloc(p_00->pArray,4);
                  }
                  p_00->pArray = piVar11;
                  if (piVar11 == (int *)0x0) goto LAB_00361542;
                  p_00->nCap = 1;
                }
                *p_00->pArray = iVar3;
                p_00->nSize = 1;
                Vec_IntPush(p_00,uVar6);
                Vec_IntPush(p_00,uVar8);
                if (((int)uVar7 < 1) || (pNew->nObjsAlloc <= (int)uVar7)) goto LAB_003614c6;
                Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar7,p_00);
              }
              if (uVar8 != 0xffffffff && uVar6 != 0xffffffff) goto LAB_00361259;
            }
            else {
              if (uVar14 != 0x37) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x549,
                              "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              paVar12 = &pWVar1->field_10;
              if (2 < pWVar1->nFanins) {
                paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
              }
              iVar3 = paVar12->Fanins[0];
              if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) goto LAB_00361504;
              if (piVar11[iVar3] != -1) {
                iVar17 = pWVar10->End - pWVar10->Beg;
                iVar3 = -iVar17;
                if (0 < iVar17) {
                  iVar3 = iVar17;
                }
                paVar12 = &pWVar1->field_10;
                if (2 < pWVar1->nFanins) {
                  paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
                }
                lVar16 = (long)paVar12[1].Fanins[0];
                if ((lVar16 < 1) || (p->nObjsAlloc <= paVar12[1].Fanins[0])) goto LAB_003614c6;
                iVar18 = pWVar4[lVar16].End - pWVar4[lVar16].Beg;
                iVar17 = -iVar18;
                if (0 < iVar18) {
                  iVar17 = iVar18;
                }
                if (iVar3 == iVar17) {
                  uVar6 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
                  if ((0 < (int)uVar6) && ((int)uVar6 < pNew->nObjsAlloc)) {
                    if ((2 < pWVar10->nFanins) ||
                       (paVar12 = &pWVar10->field_10,
                       (undefined1  [24])((undefined1  [24])*pWVar10 & (undefined1  [24])0x2f) ==
                       (undefined1  [24])0x6)) {
                      paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                                (pWVar10->field_10).pFanins[0];
                    }
                    iVar3 = paVar12->Fanins[1];
                    if ((-1 < (long)iVar3) && (iVar17 = (p->vCopies).nSize, iVar3 < iVar17)) {
                      if ((pWVar1->nFanins < 3) &&
                         ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
                          (undefined1  [24])0x6)) {
                        paVar12 = &pWVar1->field_10;
                      }
                      else {
                        paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                                  (pWVar1->field_10).pFanins[0];
                      }
                      iVar18 = paVar12->Fanins[1];
                      if (((long)iVar18 < 0) || (iVar17 <= iVar18)) goto LAB_00361504;
                      piVar11 = (p->vCopies).pArray;
                      iVar3 = piVar11[iVar3];
                      iVar17 = piVar11[iVar18];
                      pWVar4 = pNew->pObjs;
                      if (p_00->nCap < 2) {
                        if (p_00->pArray == (int *)0x0) {
                          piVar11 = (int *)malloc(8);
                        }
                        else {
                          piVar11 = (int *)realloc(p_00->pArray,8);
                        }
                        p_00->pArray = piVar11;
                        if (piVar11 == (int *)0x0) goto LAB_00361542;
                        p_00->nCap = 2;
                      }
                      piVar11 = p_00->pArray;
                      lVar16 = 0;
                      do {
                        iVar18 = iVar17;
                        if (lVar16 == 0) {
                          iVar18 = iVar3;
                        }
                        piVar11[lVar16] = iVar18;
                        lVar16 = lVar16 + 1;
                      } while (lVar16 != 2);
                      p_00->nSize = 2;
                      Wlc_ObjAddFanins(pNew,pWVar4 + uVar6,p_00);
                      iVar17 = pWVar10->End - pWVar10->Beg;
                      iVar3 = -iVar17;
                      if (0 < iVar17) {
                        iVar3 = iVar17;
                      }
                      uVar8 = Wlc_ObjAlloc(pNew,8,0,iVar3,0);
                      uVar19 = (ulong)uVar8;
                      pWVar5 = pNew->pObjs;
                      if (p_00->nCap < 1) {
                        if (p_00->pArray == (int *)0x0) {
                          piVar11 = (int *)malloc(4);
                        }
                        else {
                          piVar11 = (int *)realloc(p_00->pArray,4);
                        }
                        p_00->pArray = piVar11;
                        if (piVar11 == (int *)0x0) goto LAB_00361542;
                        p_00->nCap = 1;
                      }
                      *p_00->pArray =
                           (int)((ulong)((long)(pWVar4 + uVar6) - (long)pWVar5) >> 3) * -0x55555555;
                      p_00->nSize = 1;
                      if ((pWVar1->nFanins < 3) &&
                         ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
                          (undefined1  [24])0x6)) {
                        paVar12 = &pWVar1->field_10;
                      }
                      else {
                        paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                                  (pWVar1->field_10).pFanins[0];
                      }
                      iVar3 = paVar12[1].Fanins[0];
                      if ((-1 < (long)iVar3) && (iVar3 < (p->vCopies).nSize)) {
                        Vec_IntPush(p_00,(p->vCopies).pArray[iVar3]);
                        if ((pWVar1->nFanins < 3) &&
                           ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f)
                            != (undefined1  [24])0x6)) {
                          paVar12 = &pWVar1->field_10;
                        }
                        else {
                          paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                                    (pWVar1->field_10).pFanins[0];
                        }
                        iVar3 = paVar12->Fanins[0];
                        if ((-1 < (long)iVar3) && (iVar3 < (p->vCopies).nSize)) {
                          Vec_IntPush(p_00,(p->vCopies).pArray[iVar3]);
                          if ((0 < (int)uVar8) && ((int)uVar8 < pNew->nObjsAlloc)) {
                            Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar8,p_00);
                            goto LAB_00361259;
                          }
                          goto LAB_003614c6;
                        }
                      }
                    }
                    goto LAB_00361504;
                  }
                  goto LAB_003614c6;
                }
              }
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < vMemObjsClean->nSize);
      }
      if ((pWVar10->nFanins < 3) &&
         ((undefined1  [24])((undefined1  [24])*pWVar10 & (undefined1  [24])0x2f) !=
          (undefined1  [24])0x6)) {
        paVar12 = &pWVar10->field_10;
      }
      else {
        paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar10->field_10).pFanins[0];
      }
      iVar3 = paVar12->Fanins[0];
      if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) {
LAB_00361504:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vCopies).pArray[iVar3];
      if (iVar3 == -1) {
        __assert_fail("iObjNew != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x54e,
                      "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (p_00->nCap < 1) {
        if (p_00->pArray == (int *)0x0) {
          piVar11 = (int *)malloc(4);
        }
        else {
          piVar11 = (int *)realloc(p_00->pArray,4);
        }
        p_00->pArray = piVar11;
        if (piVar11 == (int *)0x0) {
LAB_00361542:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p_00->nCap = 1;
      }
      *p_00->pArray = iVar3;
      p_00->nSize = 1;
      uVar6 = (int)((long)pWVar10 - (long)p->pObjs >> 3) * -0x55555555;
      if (((int)uVar6 < 0) || ((p->vCopies).nSize <= (int)uVar6)) goto LAB_00361504;
      iVar3 = (p->vCopies).pArray[uVar6 & 0x7fffffff];
      uVar19 = (ulong)iVar3;
      if (((long)uVar19 < 1) || (pNew->nObjsAlloc <= iVar3)) goto LAB_003614c6;
      if ((undefined1  [24])((undefined1  [24])pNew->pObjs[uVar19] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x7) {
        __assert_fail("Wlc_NtkObj(pNew, iObjNew)->Type == WLC_OBJ_BUF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x552,
                      "void Wlc_NtkCreateMemoryConstr(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar19,p_00);
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar2);
  }
  iVar2 = __ptr_00->nSize;
  if (0 < (long)iVar2) {
    piVar9 = __ptr_00->pArray;
    lVar13 = 0;
    do {
      iVar3 = piVar9[lVar13];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
LAB_003614c6:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vCopies).nSize <= iVar3) {
LAB_003614e5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar3] = -1;
      lVar13 = lVar13 + 1;
    } while (iVar2 != lVar13);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 == (Vec_Int_t *)0x0) {
    return;
  }
  free(__ptr_00);
  return;
}

Assistant:

void Wlc_NtkCreateMemoryConstr( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, Vec_Int_t * vReachReadCi )
{
    Vec_Int_t * vReads  = Wlc_NtkCollectOneType( p, vMemObjsClean, WLC_OBJ_READ, -1 );
    Vec_Int_t * vObjCis = Wlc_NtkCollectOneType( p, vMemObjsClean, WLC_OBJ_PI, WLC_OBJ_FO );
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_Obj_t * pObjR, * pObj, * pCond; 
    int i, k, iObjCi, iObjNew = -1;
    // go through read ports
    Wlc_NtkForEachObjVec( vReads, p, pObjR, i )
    {
        // ABC_READ  ( .mem_in(mem_fi1), .addr(raddr), .data(read1) ) ;
        // ABC_WRITE ( .mem_in(mem_fo1), .addr(waddr), .data(data), .mem_out(mem_fi1) ) ;
        // initialize CI related to the read port
        Vec_Int_t * vLocalCis = Wlc_NtkExtractCisForThisRead( vReachReadCi, Wlc_ObjId(p, pObjR) );
        Wlc_NtkForEachObjVec( vObjCis, p, pObj, k )
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
        Vec_IntForEachEntryDouble( vLocalCis, iObjCi, iObjNew, k )
            Wlc_ObjSetCopy( p, iObjCi, iObjNew );
        Vec_IntFree( vLocalCis );
        // implement the nodes
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
        {
            if ( Wlc_ObjIsRead(pObj) || Wlc_ObjIsCi(pObj) )
                continue;
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
            if ( Wlc_ObjIsWrite(pObj) )
            {
                if ( Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) == -1 )
                    continue;
                if ( Wlc_ObjRange(pObjR) != Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)) )
                    continue;
                // create equality
                pCond = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0) );
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObjR)), Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObj)) );
                //printf( "%d : ", Wlc_ObjId(p,pObj) ), Vec_IntPrint( vFanins );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                // create MUX
                iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pObjR)-1, 0 );
                Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pCond) );
                Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjFaninId2(pObj)) );
                Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) );
                Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
            }
            else if ( Wlc_ObjIsMux(pObj) )
            {
                int iFanin0New = Wlc_ObjCopy(p, Wlc_ObjFaninId1(pObj));
                int iFanin1New = Wlc_ObjCopy(p, Wlc_ObjFaninId2(pObj));
                if ( iFanin0New == -1 || iFanin1New == -1 )
                    continue;
                //Wlc_NtkPrintNode( pNew, Wlc_NtkObj(pNew, iFanin0New) );
                assert( Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin0New)) );
                assert( Wlc_ObjRange(pObjR) == Wlc_ObjRange(Wlc_NtkObj(pNew, iFanin1New)) );
                iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pObjR)-1, 0 );
                Vec_IntFill( vFanins, 1, Wlc_ObjCopy(p, Wlc_ObjFaninId0(pObj)) );
                Vec_IntPush( vFanins, iFanin0New );
                Vec_IntPush( vFanins, iFanin1New );
                Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
            }
            else if ( Wlc_ObjIsBuf(pObj) )
            {
                iObjNew = Wlc_ObjCopy( p, Wlc_ObjFaninId0(pObj) );
                if ( iObjNew == -1 )
                    continue;
            }
            else assert( 0 );
            Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        }
        // extract fanin
        iObjNew = Wlc_ObjCopy( p, Wlc_ObjFaninId0(pObjR) );
        assert( iObjNew != -1 );
        Vec_IntFill( vFanins, 1, iObjNew );
        // add it as buffer fanin
        iObjNew = Wlc_ObjCopy( p, Wlc_ObjId(p, pObjR) );
        assert( Wlc_NtkObj(pNew, iObjNew)->Type == WLC_OBJ_BUF );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
    }
    Wlc_NtkForEachObjVec( vObjCis, p, pObj, k )
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), -1 );
    Vec_IntFree( vFanins );
    Vec_IntFree( vReads );
    Vec_IntFree( vObjCis );
}